

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManPrintRepr(Gia_Man_t *p)

{
  ulong uVar1;
  
  if (0 < p->nObjs) {
    uVar1 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->pReprsOld[uVar1] != -1) {
        printf("%d->%d ",uVar1 & 0xffffffff,(ulong)((uint)p->pReprs[uVar1] & 0xfffffff));
      }
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)p->nObjs);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManPrintRepr( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        if ( ~p->pReprsOld[i] )
            printf( "%d->%d ", i, p->pReprs[i].iRepr );
    printf( "\n" );
}